

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall
sznet::net::TcpConnection::shrinkRSBuffer(TcpConnection *this,size_t sendSize,size_t recvSize)

{
  EventLoop *this_00;
  TcpConnection *local_80;
  code *local_78;
  undefined8 local_70;
  type local_68;
  Functor local_40;
  size_t local_20;
  size_t recvSize_local;
  size_t sendSize_local;
  TcpConnection *this_local;
  
  this_00 = this->m_loop;
  local_78 = shrinkRSBufferInLoop;
  local_70 = 0;
  local_80 = this;
  local_20 = recvSize;
  recvSize_local = sendSize;
  sendSize_local = (size_t)this;
  std::
  bind<void(sznet::net::TcpConnection::*)(unsigned_long,unsigned_long),sznet::net::TcpConnection*,unsigned_long&,unsigned_long&>
            (&local_68,(offset_in_TcpConnection_to_subr *)&local_78,&local_80,&recvSize_local,
             &local_20);
  std::function<void()>::
  function<std::_Bind<void(sznet::net::TcpConnection::*(sznet::net::TcpConnection*,unsigned_long,unsigned_long))(unsigned_long,unsigned_long)>,void>
            ((function<void()> *)&local_40,&local_68);
  EventLoop::runInLoop(this_00,&local_40);
  std::function<void_()>::~function(&local_40);
  return;
}

Assistant:

void TcpConnection::shrinkRSBuffer(size_t sendSize, size_t recvSize)
{
	m_loop->runInLoop(std::bind(&TcpConnection::shrinkRSBufferInLoop, this, sendSize, recvSize));
}